

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int expand_logbuf_or_invalidate(char *prefix,size_t prefix_len,size_t capacity)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *in_FS_OFFSET;
  
  iVar3 = 0;
  if (in_FS_OFFSET[-0x19] != 0) {
    lVar1 = *in_FS_OFFSET;
    iVar2 = ptls_buffer_reserve((ptls_buffer_t *)(lVar1 + -200),capacity + prefix_len);
    if (iVar2 == 0) {
      memcpy((void *)(in_FS_OFFSET[-0x19] + in_FS_OFFSET[-0x17]),prefix,prefix_len);
      in_FS_OFFSET[-0x17] = in_FS_OFFSET[-0x17] + prefix_len;
      iVar3 = 1;
    }
    else {
      ptls_buffer_dispose((ptls_buffer_t *)(lVar1 + -200));
      if (in_FS_OFFSET[-0x19] != 0) {
        __assert_fail("logbuf.buf.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1b30,"int expand_logbuf_or_invalidate(const char *, size_t, size_t)");
      }
    }
  }
  return iVar3;
}

Assistant:

static int expand_logbuf_or_invalidate(const char *prefix, size_t prefix_len, size_t capacity)
{
    if (logbuf.buf.base == NULL)
        return 0;

    if (ptls_buffer_reserve(&logbuf.buf, prefix_len + capacity) != 0) {
        ptls_buffer_dispose(&logbuf.buf);
        assert(logbuf.buf.base == NULL);
        return 0;
    }

    memcpy(logbuf.buf.base + logbuf.buf.off, prefix, prefix_len);
    logbuf.buf.off += prefix_len;

    return 1;
}